

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::Col<1>::idct(uint8 *pDst_ptr,int *pTemp)

{
  uint8 uVar1;
  uint local_24;
  uint8 dcval_clamped;
  int dcval;
  int *pTemp_local;
  uint8 *pDst_ptr_local;
  
  local_24 = *pTemp + 0x1010 >> 5;
  if (0xff < local_24) {
    local_24 = (int)(local_24 ^ 0xffffffff) >> 0x1f & 0xff;
  }
  uVar1 = (uint8)local_24;
  *pDst_ptr = uVar1;
  pDst_ptr[8] = uVar1;
  pDst_ptr[0x10] = uVar1;
  pDst_ptr[0x18] = uVar1;
  pDst_ptr[0x20] = uVar1;
  pDst_ptr[0x28] = uVar1;
  pDst_ptr[0x30] = uVar1;
  pDst_ptr[0x38] = uVar1;
  return;
}

Assistant:

static void idct(uint8* pDst_ptr, const int* pTemp)
		{
			int dcval = DESCALE_ZEROSHIFT(pTemp[0], PASS1_BITS + 3);
			const uint8 dcval_clamped = (uint8)CLAMP(dcval);
			pDst_ptr[0 * 8] = dcval_clamped;
			pDst_ptr[1 * 8] = dcval_clamped;
			pDst_ptr[2 * 8] = dcval_clamped;
			pDst_ptr[3 * 8] = dcval_clamped;
			pDst_ptr[4 * 8] = dcval_clamped;
			pDst_ptr[5 * 8] = dcval_clamped;
			pDst_ptr[6 * 8] = dcval_clamped;
			pDst_ptr[7 * 8] = dcval_clamped;
		}